

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_div_return_value_Test::TestBody(correctness_div_return_value_Test *this)

{
  bool bVar1;
  big_integer *this_00;
  char *message;
  AssertionResult gtest_ar;
  big_integer b;
  big_integer a;
  Message local_98;
  AssertHelper local_90;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  big_integer local_78;
  big_integer local_40;
  
  big_integer::big_integer(&local_40,100);
  big_integer::big_integer(&local_78,2);
  this_00 = big_integer::operator/=(&local_40,&local_78);
  big_integer::operator/=(this_00,&local_78);
  local_98.ss_.ptr_._0_4_ = 0x19;
  testing::internal::CmpHelperEQ<big_integer,int>(local_88,"a","25",&local_40,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message(&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x112,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_98.ss_.ptr_._4_4_,local_98.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_78);
  big_integer::~big_integer(&local_40);
  return;
}

Assistant:

TEST(correctness, div_return_value)
{
    big_integer a = 100;
    big_integer b = 2;

    (a /= b) /= b;
    EXPECT_EQ(a, 25);
}